

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RandomGen.cpp
# Opt level: O0

void __thiscall RandomGen::SetSeed(RandomGen *this,uint64_t s)

{
  runtime_error *this_00;
  uint64_t z;
  uint64_t uVar1;
  xoroshiro_plus<unsigned_long,_unsigned_long,_24U,_16U,_37U> local_40;
  uint64_t local_30;
  uint64_t s1;
  uint64_t local_18;
  uint64_t s_local;
  RandomGen *this_local;
  
  local_18 = s;
  s_local = (uint64_t)this;
  if ((this->rng_locked & 1U) != 0) {
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(this_00,"You can not change the seed because it is locked.");
    __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  z = splitmix64(s);
  local_30 = z;
  uVar1 = splitmix64(z);
  xoroshiro_detail::xoroshiro_plus<unsigned_long,_unsigned_long,_24U,_16U,_37U>::xoroshiro
            (&local_40,z,uVar1);
  (this->rng).super_xoroshiro<unsigned_long,_unsigned_long,_24U,_16U,_37U>.s0_ =
       local_40.super_xoroshiro<unsigned_long,_unsigned_long,_24U,_16U,_37U>.s0_;
  (this->rng).super_xoroshiro<unsigned_long,_unsigned_long,_24U,_16U,_37U>.s1_ =
       local_40.super_xoroshiro<unsigned_long,_unsigned_long,_24U,_16U,_37U>.s1_;
  return;
}

Assistant:

void RandomGen::SetSeed(uint64_t s) {
  if (rng_locked) {
    throw std::runtime_error("You can not change the seed because it is locked.");
  }
  uint64_t s1 = splitmix64(s);
  rng = xoroshiro128plus64(s1, splitmix64(s1));
}